

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O3

UInt32 Range_DecodeBit_RAR(void *pp,UInt32 size0)

{
  uint uVar1;
  
  uVar1 = (**pp)(pp,0x4000);
  if (size0 <= uVar1) {
    (**(code **)((long)pp + 8))(pp,size0,0x4000 - size0);
  }
  else {
    (**(code **)((long)pp + 8))(pp,0,size0);
  }
  return (uint)(size0 <= uVar1);
}

Assistant:

static UInt32 Range_DecodeBit_RAR(void *pp, UInt32 size0)
{
  CPpmd7z_RangeDec *p = (CPpmd7z_RangeDec *)pp;
  UInt32 bit, value = p->p.GetThreshold(p, PPMD_BIN_SCALE);
  if(value < size0)
  {
    bit = 0;
    p->p.Decode(p, 0, size0);
  }
  else
  {
    bit = 1;
    p->p.Decode(p, size0, PPMD_BIN_SCALE - size0);
  }
  return bit;
}